

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O1

void csp_conn_init(void)

{
  csp_queue_handle_t ppVar1;
  csp_conn_t *conn;
  long lVar2;
  
  lVar2 = -8;
  conn = arr_conn;
  do {
    conn->sport_outgoing = (char)lVar2 + '\x19';
    LOCK();
    conn->state = 0;
    UNLOCK();
    (conn->idin).flags = '\0';
    ppVar1 = csp_queue_create_static(0x10,8,conn->rx_queue_static_data,&conn->rx_queue_static);
    conn->rx_queue = ppVar1;
    csp_rdp_init(conn);
    conn = conn + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

void csp_conn_init(void) {

	for (int i = 0; i < CSP_CONN_MAX; i++) {
		csp_conn_t * conn = &arr_conn[i];

		conn->sport_outgoing = CSP_PORT_MAX_BIND + 1 + i;
		conn->state = CONN_CLOSED;
		conn->idin.flags = 0;
		conn->rx_queue = csp_queue_create_static(CSP_CONN_RXQUEUE_LEN, sizeof(csp_packet_t *), conn->rx_queue_static_data, &conn->rx_queue_static);

#if (CSP_USE_RDP)
		csp_rdp_init(conn);
#endif
	}
}